

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int arkStep_MRIStepInnerEvolve(MRIStepInnerStepper stepper,realtype t0,realtype tout,N_Vector y)

{
  int iVar1;
  void *arkode_mem;
  int nforcing;
  realtype local_38;
  N_Vector *forcing;
  realtype tscale;
  realtype tshift;
  realtype tret;
  
  local_38 = tout;
  iVar1 = MRIStepInnerStepper_GetContent(stepper,&arkode_mem);
  if (iVar1 == 0) {
    iVar1 = MRIStepInnerStepper_GetForcingData(stepper,&tshift,&tscale,&forcing,&nforcing);
    if (iVar1 == 0) {
      iVar1 = arkStep_SetInnerForcing(arkode_mem,tshift,tscale,forcing,nforcing);
      if (iVar1 == 0) {
        iVar1 = ARKStepSetStopTime(arkode_mem,local_38);
        if (iVar1 == 0) {
          iVar1 = ARKStepEvolve(arkode_mem,local_38,y,&tret,1);
          if (-1 < iVar1) {
            iVar1 = arkStep_SetInnerForcing(arkode_mem,0.0,1.0,(N_Vector *)0x0,0);
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int arkStep_MRIStepInnerEvolve(MRIStepInnerStepper stepper, realtype t0,
                               realtype tout, N_Vector y)
{
  void*    arkode_mem;     /* arkode memory             */
  realtype tret;           /* return time               */
  realtype tshift, tscale; /* time normalization values */
  N_Vector *forcing;       /* forcing vectors           */
  int      nforcing;       /* number of forcing vectors */
  int      retval;         /* return value              */

  /* extract the ARKODE memory struct */
  retval = MRIStepInnerStepper_GetContent(stepper, &arkode_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* get the forcing data */
  retval = MRIStepInnerStepper_GetForcingData(stepper,
                                              &tshift, &tscale,
                                              &forcing, &nforcing);
  if (retval != ARK_SUCCESS) return(retval);

  /* set the inner forcing data */
  retval = arkStep_SetInnerForcing(arkode_mem, tshift, tscale,
                                   forcing, nforcing);
  if (retval != ARK_SUCCESS) return(retval);

  /* set the stop time */
  retval = ARKStepSetStopTime(arkode_mem, tout);
  if (retval != ARK_SUCCESS) return(retval);

  /* evolve inner ODE */
  retval = ARKStepEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);
  if (retval < 0) return(retval);

  /* disable inner forcing */
  retval = arkStep_SetInnerForcing(arkode_mem, ZERO, ONE, NULL, 0);
  if (retval != ARK_SUCCESS) return(retval);

  return(ARK_SUCCESS);
}